

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCylinderShape.cpp
# Opt level: O2

void __thiscall
chrono::ChRoundedCylinderShape::ArchiveOUT(ChRoundedCylinderShape *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::geometry::ChRoundedCylinder> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChRoundedCylinderShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->groundedcyl;
  local_28._name = "groundedcyl";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChRoundedCylinderShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChRoundedCylinderShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(groundedcyl);
}